

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

void compose_patch(cJSON *patches,uchar *operation,uchar *path,uchar *suffix,cJSON *value)

{
  uchar uVar1;
  long lVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *__s;
  uchar *puVar5;
  size_t length;
  long lVar6;
  
  if (path != (uchar *)0x0 && (operation != (uchar *)0x0 && patches != (cJSON *)0x0)) {
    lVar2 = cJSON_CreateObject();
    if (lVar2 != 0) {
      uVar3 = cJSON_CreateString(operation);
      cJSON_AddItemToObject(lVar2,"op",uVar3);
      if (suffix != (uchar *)0x0) {
        lVar6 = 0;
        puVar5 = suffix;
        do {
          uVar1 = *puVar5;
          if ((uVar1 == '/') || (uVar1 == '~')) {
            lVar6 = lVar6 + 1;
          }
          else if (uVar1 == '\0') goto LAB_00101d2c;
          puVar5 = puVar5 + 1;
          lVar6 = lVar6 + 1;
        } while( true );
      }
      uVar3 = cJSON_CreateString(path);
      cJSON_AddItemToObject(lVar2,"path",uVar3);
      goto LAB_00101de5;
    }
  }
  return;
LAB_00101d2c:
  sVar4 = strlen((char *)path);
  __s = (char *)cJSON_malloc(lVar6 + sVar4 + 2);
  sprintf(__s,"%s/",path);
  puVar5 = (uchar *)(__s + sVar4);
  do {
    uVar1 = *suffix;
    if (uVar1 == '/') {
      puVar5[1] = '~';
      puVar5[2] = '1';
LAB_00101d97:
      puVar5 = puVar5 + 2;
    }
    else {
      if (uVar1 == '~') {
        puVar5[1] = '~';
        puVar5[2] = '0';
        goto LAB_00101d97;
      }
      puVar5 = puVar5 + 1;
      if (uVar1 == '\0') break;
      *puVar5 = uVar1;
    }
    suffix = suffix + 1;
  } while( true );
  *puVar5 = '\0';
  uVar3 = cJSON_CreateString(__s);
  cJSON_AddItemToObject(lVar2,"path",uVar3);
  cJSON_free(__s);
LAB_00101de5:
  if (value != (cJSON *)0x0) {
    uVar3 = cJSON_Duplicate(value,1);
    cJSON_AddItemToObject(lVar2,"value",uVar3);
  }
  cJSON_AddItemToArray(patches,lVar2);
  return;
}

Assistant:

static void compose_patch(cJSON * const patches, const unsigned char * const operation, const unsigned char * const path, const unsigned char *suffix, const cJSON * const value)
{
    cJSON *patch = NULL;

    if ((patches == NULL) || (operation == NULL) || (path == NULL))
    {
        return;
    }

    patch = cJSON_CreateObject();
    if (patch == NULL)
    {
        return;
    }
    cJSON_AddItemToObject(patch, "op", cJSON_CreateString((const char*)operation));

    if (suffix == NULL)
    {
        cJSON_AddItemToObject(patch, "path", cJSON_CreateString((const char*)path));
    }
    else
    {
        size_t suffix_length = pointer_encoded_length(suffix);
        size_t path_length = strlen((const char*)path);
        unsigned char *full_path = (unsigned char*)cJSON_malloc(path_length + suffix_length + sizeof("/"));

        sprintf((char*)full_path, "%s/", (const char*)path);
        encode_string_as_pointer(full_path + path_length + 1, suffix);

        cJSON_AddItemToObject(patch, "path", cJSON_CreateString((const char*)full_path));
        cJSON_free(full_path);
    }

    if (value != NULL)
    {
        cJSON_AddItemToObject(patch, "value", cJSON_Duplicate(value, 1));
    }
    cJSON_AddItemToArray(patches, patch);
}